

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::Path::validatePart(Path *this,StringPtr part)

{
  bool bVar1;
  char *__s;
  byte local_129;
  Fault local_128;
  Fault f_2;
  DebugExpression<kj::Maybe<unsigned_long>_> local_110;
  undefined1 local_100 [8];
  DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> _kjCondition_2;
  Fault f_1;
  size_t local_c0;
  DebugExpression<unsigned_long> local_b8;
  undefined1 local_b0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  Fault local_78;
  Fault f;
  StringPtr local_60;
  StringPtr *local_50;
  DebugComparison<kj::StringPtr_&,_const_char_(&)[1]> local_48;
  bool local_19;
  undefined1 auStack_18 [7];
  bool _kjCondition;
  StringPtr part_local;
  
  part_local.content.ptr = part.content.ptr;
  _auStack_18 = this;
  local_50 = (StringPtr *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)auStack_18);
  kj::_::DebugExpression<kj::StringPtr&>::operator!=
            (&local_48,(DebugExpression<kj::StringPtr&> *)&local_50,(char (*) [1])0x918ec2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_48);
  local_129 = 0;
  if (bVar1) {
    StringPtr::StringPtr(&local_60,".");
    bVar1 = StringPtr::operator==((StringPtr *)auStack_18,&local_60);
    local_129 = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      StringPtr::StringPtr((StringPtr *)&f,"..");
      bVar1 = StringPtr::operator==((StringPtr *)auStack_18,(StringPtr *)&f);
      local_129 = bVar1 ^ 0xff;
    }
  }
  local_19 = (bool)(local_129 & 1);
  if (local_19 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[23],kj::StringPtr&>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x133,FAILED,"part != \"\" && part != \".\" && part != \"..\"",
               "_kjCondition,\"invalid path component\", part",&local_19,
               (char (*) [23])"invalid path component",(StringPtr *)auStack_18);
    kj::_::Debug::Fault::fatal(&local_78);
  }
  __s = StringPtr::begin((StringPtr *)auStack_18);
  local_c0 = strlen(__s);
  local_b8 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
  f_1.exception = (Exception *)StringPtr::size((StringPtr *)auStack_18);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_b0,&local_b8,
             (unsigned_long *)&f_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::StringPtr&>
              ((Fault *)&_kjCondition_2.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x134,FAILED,"strlen(part.begin()) == part.size()",
               "_kjCondition,\"NUL character in path component\", part",
               (DebugComparison<unsigned_long,_unsigned_long> *)local_b0,
               (char (*) [32])"NUL character in path component",(StringPtr *)auStack_18);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
  }
  StringPtr::findFirst((StringPtr *)&f_2,(char)auStack_18);
  kj::_::DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_110,(Maybe<unsigned_long> *)&kj::_::MAGIC_ASSERT);
  kj::_::DebugExpression<kj::Maybe<unsigned_long>>::operator==
            ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_100,
             (DebugExpression<kj::Maybe<unsigned_long>> *)&local_110,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<unsigned_long>_>::~DebugExpression(&local_110);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&f_2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_100);
  if (bVar1) {
    kj::_::DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&>::~DebugComparison
              ((DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_100);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&,char_const(&)[68],kj::StringPtr&>
            (&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x136,FAILED,"part.findFirst(\'/\') == kj::none",
             "_kjCondition,\"\'/\' character in path component; did you mean to use Path::parse()?\", part"
             ,(DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)local_100,
             (char (*) [68])"\'/\' character in path component; did you mean to use Path::parse()?",
             (StringPtr *)auStack_18);
  kj::_::Debug::Fault::fatal(&local_128);
}

Assistant:

void Path::validatePart(StringPtr part) {
  KJ_REQUIRE(part != "" && part != "." && part != "..", "invalid path component", part);
  KJ_REQUIRE(strlen(part.begin()) == part.size(), "NUL character in path component", part);
  KJ_REQUIRE(part.findFirst('/') == kj::none,
      "'/' character in path component; did you mean to use Path::parse()?", part);
}